

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

addrinfo * Jupiter::Socket::getAddrInfo(addrinfo *addr,uint result)

{
  int iVar1;
  addrinfo *ptr;
  bool bVar2;
  
  if (result != 0 && addr != (addrinfo *)0x0) {
    iVar1 = result - 1;
    do {
      addr = addr->ai_next;
      bVar2 = iVar1 != 0;
      iVar1 = iVar1 + -1;
      if (addr == (addrinfo *)0x0) {
        return (addrinfo *)0x0;
      }
    } while (bVar2);
  }
  return addr;
}

Assistant:

addrinfo *Jupiter::Socket::getAddrInfo(addrinfo *addr, unsigned int result) { // static
	addrinfo* ptr = addr;
	while (ptr != nullptr && result != 0) {
		ptr = ptr->ai_next;
		--result;
	}

	return ptr;
}